

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

QRegion __thiscall QTreeView::visualRegionForSelection(QTreeView *this,QItemSelection *selection)

{
  QTreeViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  Representation RVar6;
  Representation RVar7;
  long in_RDX;
  QItemSelectionRange *pQVar8;
  Representation RVar9;
  QItemSelectionRange *this_01;
  long in_FS_OFFSET;
  QRect QVar10;
  undefined1 local_e8 [12];
  Representation RStack_dc;
  undefined1 local_d8 [16];
  QAbstractItemModel *local_c8;
  undefined1 local_b8 [16];
  QModelIndex local_a8;
  QModelIndex local_88;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDX + 0x10) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QRegion::QRegion((QRegion *)this);
      return (QRegion)this;
    }
  }
  else {
    this_00 = (QTreeViewPrivate *)(selection->super_QList<QItemSelectionRange>).d.ptr;
    *(undefined1 **)
     &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget =
         &DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)this);
    local_48 = QWidget::rect((this_00->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.viewport);
    this_01 = *(QItemSelectionRange **)(in_RDX + 8);
    pQVar8 = this_01 + *(long *)(in_RDX + 0x10);
    for (; this_01 != pQVar8; this_01 = this_01 + 1) {
      bVar2 = QItemSelectionRange::isValid(this_01);
      if (bVar2) {
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::parent();
        local_88.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_88.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_88,&this_01->tl);
        pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
        iVar4 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&local_68);
        while( true ) {
          if (((local_88.r < 0) || ((long)local_88._0_8_ < 0)) ||
             (local_88.m.ptr == (QAbstractItemModel *)0x0)) break;
          cVar3 = (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x2c].
                               super_QArrayData)(selection,&local_88);
          if (cVar3 == '\0') break;
          if (local_88.c + 1 < iVar4) {
            pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
            (**(code **)(*(long *)pQVar1 + 0x60))
                      (&local_a8,pQVar1,local_88._0_8_ & 0xffffffff,local_88.c + 1,&local_68);
            local_88.m.ptr = local_a8.m.ptr;
            local_88._0_8_ = local_a8._0_8_;
            local_88.i = local_a8.i;
          }
          else {
            local_88.i = 0;
            local_88.m.ptr = (QAbstractItemModel *)0x0;
            local_88._0_8_ = (undefined1 *)0xffffffffffffffff;
          }
        }
        if (((-1 < local_88.r) && (-1 < local_88.c)) &&
           (local_88.m.ptr != (QAbstractItemModel *)0x0)) {
          local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QVar10 = QTreeViewPrivate::visualRect(this_00,&local_88,SingleSection);
          local_a8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          local_b8 = (undefined1  [16])QVar10;
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a8,&this_01->br);
          while( true ) {
            if (((local_a8.r < 0) || ((long)local_a8._0_8_ < 0)) ||
               (local_a8.m.ptr == (QAbstractItemModel *)0x0)) break;
            cVar3 = (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x2c].
                                 super_QArrayData)(selection,&local_a8);
            if (cVar3 == '\0') break;
            if (local_a8.c < 1) {
              local_a8.i = 0;
              local_a8.m.ptr = (QAbstractItemModel *)0x0;
              local_a8._0_8_ = (undefined1 *)0xffffffffffffffff;
            }
            else {
              pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
              (**(code **)(*(long *)pQVar1 + 0x60))
                        (local_d8,pQVar1,local_a8._0_8_ & 0xffffffff,local_a8.c + -1,&local_68);
              local_a8.m.ptr = local_c8;
              local_a8._0_8_ = local_d8._0_8_;
              local_a8.i = local_d8._8_8_;
            }
          }
          if (((-1 < local_a8.r) && (-1 < local_a8.c)) &&
             (local_a8.m.ptr != (QAbstractItemModel *)0x0)) {
            local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_d8 = (undefined1  [16])
                       QTreeViewPrivate::visualRect(this_00,&local_a8,SingleSection);
            RVar6 = QVar10.y1.m_i;
            RVar7.m_i = local_d8._12_4_;
            RVar9.m_i = RVar7.m_i;
            if (RVar6.m_i < RVar7.m_i) {
              RVar9.m_i = RVar6.m_i;
            }
            if (RVar7.m_i < RVar6.m_i) {
              RVar7.m_i = RVar6.m_i;
            }
            bVar2 = QHeaderView::sectionsMoved(this_00->header);
            if (bVar2) {
              for (iVar4 = QPersistentModelIndex::column(); iVar5 = QPersistentModelIndex::column(),
                  iVar4 <= iVar5; iVar4 = iVar4 + 1) {
                local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                stack0xffffffffffffff20 = &DAT_aaaaaaaaaaaaaaaa;
                RVar6.m_i = columnViewportPosition((QTreeView *)selection,iVar4);
                iVar5 = columnWidth((QTreeView *)selection,iVar4);
                local_e8._4_4_ = RVar9.m_i;
                local_e8._0_4_ = RVar6.m_i;
                RStack_dc.m_i = RVar7.m_i;
                local_e8._8_4_ = iVar5 + RVar6.m_i + -1;
                cVar3 = QRect::intersects(&local_48);
                if (cVar3 != '\0') {
                  QRegion::operator+=((QRegion *)this,(QRect *)local_e8);
                }
              }
            }
            else {
              local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              stack0xffffffffffffff20 = &DAT_aaaaaaaaaaaaaaaa;
              _local_e8 = (QRect)QRect::operator|((QRect *)local_b8,(QRect *)local_d8);
              QWidget::isRightToLeft((QWidget *)selection);
              iVar4 = QPersistentModelIndex::column();
              RVar7.m_i = columnViewportPosition((QTreeView *)selection,iVar4);
              local_e8._0_4_ = RVar7.m_i;
              cVar3 = QRect::intersects(&local_48);
              if (cVar3 != '\0') {
                QRegion::operator+=((QRegion *)this,(QRect *)local_e8);
              }
            }
          }
        }
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (QRegion)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QRegion QTreeView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QTreeView);
    if (selection.isEmpty())
        return QRegion();

    QRegion selectionRegion;
    const QRect &viewportRect = d->viewport->rect();
    for (const auto &range : selection) {
        if (!range.isValid())
            continue;
        QModelIndex parent = range.parent();
        QModelIndex leftIndex = range.topLeft();
        int columnCount = d->model->columnCount(parent);
        while (leftIndex.isValid() && isIndexHidden(leftIndex)) {
            if (leftIndex.column() + 1 < columnCount)
                leftIndex = d->model->index(leftIndex.row(), leftIndex.column() + 1, parent);
            else
                leftIndex = QModelIndex();
        }
        if (!leftIndex.isValid())
            continue;
        const QRect leftRect = d->visualRect(leftIndex, QTreeViewPrivate::SingleSection);
        int top = leftRect.top();
        QModelIndex rightIndex = range.bottomRight();
        while (rightIndex.isValid() && isIndexHidden(rightIndex)) {
            if (rightIndex.column() - 1 >= 0)
                rightIndex = d->model->index(rightIndex.row(), rightIndex.column() - 1, parent);
            else
                rightIndex = QModelIndex();
        }
        if (!rightIndex.isValid())
            continue;
        const QRect rightRect = d->visualRect(rightIndex, QTreeViewPrivate::SingleSection);
        int bottom = rightRect.bottom();
        if (top > bottom)
            qSwap<int>(top, bottom);
        int height = bottom - top + 1;
        if (d->header->sectionsMoved()) {
            for (int c = range.left(); c <= range.right(); ++c) {
                const QRect rangeRect(columnViewportPosition(c), top, columnWidth(c), height);
                if (viewportRect.intersects(rangeRect))
                    selectionRegion += rangeRect;
            }
        } else {
            QRect combined = leftRect|rightRect;
            combined.setX(columnViewportPosition(isRightToLeft() ? range.right() : range.left()));
            if (viewportRect.intersects(combined))
                selectionRegion += combined;
        }
    }
    return selectionRegion;
}